

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaDefragmentationContext_T::MoveDataToFreeBlocks
          (VmaDefragmentationContext_T *this,VmaSuballocationType currentType,VmaBlockVector *vector
          ,size_t firstFreeBlock,bool *texturePresent,bool *bufferPresent,bool *otherPresent)

{
  VmaBlockMetadata *pVVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  VmaDeviceMemoryBlock *pVVar5;
  undefined4 extraout_var;
  VmaBlockVector *pVVar6;
  VkDeviceSize bytes;
  undefined4 extraout_var_00;
  size_t sVar7;
  VmaBlockMetadata *in_RCX;
  VmaBlockVector *in_RDI;
  undefined1 *in_R8;
  undefined1 *in_R9;
  undefined1 *in_stack_00000008;
  MoveAllocationData moveData;
  VmaAllocHandle handle;
  VmaBlockMetadata *metadata;
  VmaDeviceMemoryBlock *block;
  size_t i;
  size_t prevMoveCount;
  size_t in_stack_ffffffffffffff48;
  VmaBlockVector *in_stack_ffffffffffffff50;
  VmaBlockMetadata *in_stack_ffffffffffffff58;
  VmaSuballocationType in_stack_ffffffffffffff60;
  CounterStatus in_stack_ffffffffffffff64;
  MoveAllocationData *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  VmaDefragmentationContext_T *in_stack_ffffffffffffff88;
  VmaAllocation_T *local_70;
  long local_60;
  VmaBlockMetadata *local_48;
  
  sVar4 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                    ((VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                     &in_RDI->m_PreferredBlockSize);
  local_48 = in_RCX;
  do {
    if (local_48 == (VmaBlockMetadata *)0x0) {
      sVar7 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                        ((VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>
                          *)&in_RDI->m_PreferredBlockSize);
      return sVar4 == sVar7;
    }
    local_48 = (VmaBlockMetadata *)&local_48[-1].field_0x27;
    pVVar5 = VmaBlockVector::GetBlock(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pVVar1 = pVVar5->m_pMetadata;
    iVar3 = (*pVVar1->_vptr_VmaBlockMetadata[0xb])();
    local_60 = CONCAT44(extraout_var,iVar3);
    while (local_60 != 0) {
      GetMoveData((VmaAllocHandle)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff58);
      pVVar6 = (VmaBlockVector *)VmaAllocation_T::GetUserData(local_70);
      if (pVVar6 != in_RDI) {
        bytes = VmaAllocation_T::GetSize(local_70);
        in_stack_ffffffffffffff64 = CheckCounters((VmaDefragmentationContext_T *)in_RDI,bytes);
        if (in_stack_ffffffffffffff64 != Pass) {
          if (in_stack_ffffffffffffff64 == Ignore) goto LAB_002fb8d6;
          if (in_stack_ffffffffffffff64 == End) {
            return true;
          }
        }
        bVar2 = VmaIsBufferImageGranularityConflict
                          (in_stack_ffffffffffffff60,
                           (VmaSuballocationType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if (!bVar2) {
          in_stack_ffffffffffffff58 = in_RCX;
          VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2fb855);
          bVar2 = AllocInOtherBlock(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                    in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RDI);
          if (bVar2) {
            return false;
          }
        }
        bVar2 = VmaIsBufferImageGranularityConflict
                          (in_stack_ffffffffffffff60,
                           (VmaSuballocationType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if (bVar2) {
          bVar2 = VmaIsBufferImageGranularityConflict
                            (in_stack_ffffffffffffff60,
                             (VmaSuballocationType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          if (bVar2) {
            *in_stack_00000008 = 1;
          }
          else {
            *in_R9 = 1;
          }
        }
        else {
          *in_R8 = 1;
        }
      }
LAB_002fb8d6:
      iVar3 = (*pVVar1->_vptr_VmaBlockMetadata[0xc])(pVVar1,local_60);
      local_60 = CONCAT44(extraout_var_00,iVar3);
    }
  } while( true );
}

Assistant:

bool VmaDefragmentationContext_T::MoveDataToFreeBlocks(VmaSuballocationType currentType, 
    VmaBlockVector& vector, size_t firstFreeBlock,
    bool& texturePresent, bool& bufferPresent, bool& otherPresent)
{
    const size_t prevMoveCount = m_Moves.size();
    for (size_t i = firstFreeBlock ; i;)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(--i);
        VmaBlockMetadata* metadata = block->m_pMetadata;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Move only single type of resources at once
            if (!VmaIsBufferImageGranularityConflict(moveData.type, currentType))
            {
                // Try to fit allocation into free blocks
                if (AllocInOtherBlock(firstFreeBlock, vector.GetBlockCount(), moveData, vector))
                    return false;
            }

            if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL))
                texturePresent = true;
            else if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_BUFFER))
                bufferPresent = true;
            else
                otherPresent = true;
        }
    }
    return prevMoveCount == m_Moves.size();
}